

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O3

int bucket_remove(bucket b,comparable_callback compare_cb,void *key,void **value)

{
  pair ppVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t line;
  char *message;
  ulong new_capacity;
  
  if ((compare_cb == (comparable_callback)0x0 || b == (bucket)0x0) || key == (void *)0x0) {
    message = "Invalid bucket remove parameters";
    line = 0x115;
  }
  else if ((b->pairs == (pair)0x0) || (b->count == 0)) {
    message = "Invalid bucket remove pairs";
    line = 0x11b;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    while( true ) {
      ppVar1 = b->pairs;
      iVar4 = (*compare_cb)(key,*(comparable *)((long)&ppVar1->key + lVar6));
      if (iVar4 == 0) break;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
      if (b->count <= uVar5) {
        return 1;
      }
    }
    pvVar2 = *(void **)((long)&ppVar1->value + lVar6);
    uVar3 = b->capacity;
    new_capacity = uVar3 >> 1;
    memmove((void *)((long)&ppVar1->key + lVar6),(void *)((long)&b->pairs[1].key + lVar6),
            (b->count - uVar5) * 0x10 - 0x10);
    uVar5 = b->count - 1;
    b->count = uVar5;
    if ((uVar3 < 10 || new_capacity < uVar5) ||
       (iVar4 = bucket_realloc_pairs(b,new_capacity), iVar4 == 0)) {
      if (value != (void **)0x0) {
        *value = pvVar2;
        return 0;
      }
      return 0;
    }
    message = "Invalid bucket remove pairs reallocation";
    line = 0x133;
  }
  log_write_impl_va("metacall",line,"bucket_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,LOG_LEVEL_ERROR,message);
  return 1;
}

Assistant:

int bucket_remove(bucket b, comparable_callback compare_cb, void *key, void **value)
{
	size_t iterator;

	if (b == NULL || compare_cb == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove parameters");
		return 1;
	}

	if (b->pairs == NULL || b->count == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs");
		return 1;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			void *deleted_value = p->value;

			size_t next = iterator + 1;

			size_t new_capacity = b->capacity >> 1;

			memmove(p, &b->pairs[next], sizeof(struct pair_type) * (b->count - next));

			--b->count;

			if (b->count <= new_capacity && new_capacity > BUCKET_PAIRS_DEFAULT)
			{
				if (bucket_realloc_pairs(b, new_capacity) != 0)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs reallocation");
					return 1;
				}
			}

			if (value != NULL)
			{
				*value = deleted_value;
			}

			return 0;
		}
	}

	return 1;
}